

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_xpointer(void)

{
  int iVar1;
  int iVar2;
  int test_ret;
  uint uVar3;
  int n_str;
  uint uVar4;
  undefined8 uVar5;
  undefined8 *puVar6;
  
  if (quiet == '\0') {
    puts("Testing xpointer : 13 of 21 functions ...");
  }
  puVar6 = &DAT_00162d68;
  uVar3 = 0;
  uVar4 = 0;
  do {
    iVar1 = xmlMemBlocks();
    if (uVar4 < 4) {
      uVar5 = *puVar6;
    }
    else {
      uVar5 = 0;
    }
    xmlXPtrEval(uVar5,0);
    xmlXPathFreeObject();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPtrEval",(ulong)(uint)(iVar2 - iVar1));
      uVar3 = uVar3 + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    uVar4 = uVar4 + 1;
    puVar6 = puVar6 + 1;
  } while (uVar4 != 5);
  function_tests = function_tests + 1;
  if (uVar3 != 0) {
    printf("Module xpointer: %d errors\n",(ulong)uVar3);
  }
  return uVar3;
}

Assistant:

static int
test_xpointer(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xpointer : 13 of 21 functions ...\n");
    test_ret += test_xmlXPtrBuildNodeList();
    test_ret += test_xmlXPtrEval();
    test_ret += test_xmlXPtrEvalRangePredicate();
    test_ret += test_xmlXPtrNewCollapsedRange();
    test_ret += test_xmlXPtrNewContext();
    test_ret += test_xmlXPtrNewLocationSetNodeSet();
    test_ret += test_xmlXPtrNewLocationSetNodes();
    test_ret += test_xmlXPtrNewRange();
    test_ret += test_xmlXPtrNewRangeNodeObject();
    test_ret += test_xmlXPtrNewRangeNodePoint();
    test_ret += test_xmlXPtrNewRangeNodes();
    test_ret += test_xmlXPtrNewRangePointNode();
    test_ret += test_xmlXPtrNewRangePoints();
    test_ret += test_xmlXPtrRangeToFunction();

    if (test_ret != 0)
	printf("Module xpointer: %d errors\n", test_ret);
    return(test_ret);
}